

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

ostream * wasm::printModuleComponent(Expression *curr,ostringstream *stream,Module *wasm)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  ModuleExpression pair;
  
  if (curr != (Expression *)0x0) {
    lVar1 = std::ostream::tellp();
    if (lVar1 < 0x4000) {
      pair.second = curr;
      pair.first = wasm;
      poVar2 = std::operator<<((ostream *)stream,pair);
      std::operator<<(poVar2,'\n');
    }
    else {
      poVar2 = std::operator<<((ostream *)stream,"[not printing ");
      pcVar3 = getExpressionName(curr);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2," because output is already very large]\n");
    }
  }
  return (ostream *)stream;
}

Assistant:

inline std::ostream& printModuleComponent(Expression* curr,
                                          std::ostringstream& stream,
                                          Module& wasm) {
  if (curr) {
    // Print the full expression if we can, but avoid doing so if the output is
    // already very large. This avoids quadratic output in some cases (e.g. if
    // we have many nested expressions in each other, all of which fail to
    // validate).
    const std::ostringstream::pos_type MAX_OUTPUT = 16 * 1024;
    if (stream.tellp() < MAX_OUTPUT) {
      stream << ModuleExpression(wasm, curr) << '\n';
    } else {
      // Print something, at least.
      stream << "[not printing " << getExpressionName(curr)
             << " because output is already very large]\n";
    }
  }
  return stream;
}